

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O2

realtype N_VMinQuotient_SensWrapper(N_Vector num,N_Vector denom)

{
  long lVar1;
  realtype rVar2;
  realtype rVar3;
  
  rVar2 = N_VMinQuotient((N_Vector)**num->content,(N_Vector)**denom->content);
  for (lVar1 = 1; lVar1 < (int)*(long *)((long)num->content + 8); lVar1 = lVar1 + 1) {
    rVar3 = N_VMinQuotient(*(N_Vector *)(*num->content + lVar1 * 8),
                           *(N_Vector *)(*denom->content + lVar1 * 8));
    if (rVar2 <= rVar3) {
      rVar3 = rVar2;
    }
    rVar2 = rVar3;
  }
  return rVar2;
}

Assistant:

realtype N_VMinQuotient_SensWrapper(N_Vector num, N_Vector denom)
{
  int i;
  realtype min, tmp;

  min = N_VMinQuotient(NV_VEC_SW(num,0), NV_VEC_SW(denom,0));

  for (i=1; i < NV_NVECS_SW(num); i++) {
    tmp = N_VMinQuotient(NV_VEC_SW(num,i), NV_VEC_SW(denom,i));
    if (tmp < min) min = tmp;
  }

  return(min);
}